

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

CURLcode Curl_shuffle_addr(Curl_easy *data,Curl_addrinfo **addr)

{
  undefined8 uVar1;
  CURLcode CVar2;
  Curl_addrinfo *pCVar3;
  undefined8 *puVar4;
  ulong uVar5;
  uchar *rnd;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  pCVar3 = *addr;
  CVar2 = CURLE_OK;
  uVar8 = 0;
  if (pCVar3 != (Curl_addrinfo *)0x0) {
    uVar8 = 0;
    do {
      pCVar3 = pCVar3->ai_next;
      uVar8 = uVar8 + 1;
    } while (pCVar3 != (Curl_addrinfo *)0x0);
  }
  if (1 < (int)uVar8) {
    Curl_infof(data,"Shuffling %i addresses",(ulong)uVar8);
    uVar7 = (ulong)uVar8;
    puVar4 = (undefined8 *)(*Curl_cmalloc)(uVar7 * 8);
    if (puVar4 == (undefined8 *)0x0) {
      CVar2 = CURLE_OUT_OF_MEMORY;
    }
    else {
      *puVar4 = *addr;
      uVar5 = 1;
      do {
        puVar4[uVar5] = *(undefined8 *)(puVar4[uVar5 - 1] + 0x28);
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
      rnd = (uchar *)(*Curl_cmalloc)(uVar7 * 4);
      if (rnd == (uchar *)0x0) {
        CVar2 = CURLE_OUT_OF_MEMORY;
      }
      else {
        CVar2 = Curl_rand(data,rnd,uVar7 * 4);
        if (CVar2 == CURLE_OK) {
          uVar7 = (ulong)(uVar8 - 1);
          uVar6 = uVar8;
          do {
            uVar1 = puVar4[(ulong)*(uint *)(rnd + uVar7 * 4) % (ulong)uVar6];
            puVar4[(ulong)*(uint *)(rnd + uVar7 * 4) % (ulong)uVar6] = puVar4[uVar7];
            puVar4[uVar7] = uVar1;
            uVar7 = uVar7 - 1;
            uVar6 = uVar6 - 1;
          } while (1 < (int)uVar6);
          uVar7 = 2;
          if (2 < (int)uVar8) {
            uVar7 = (ulong)uVar8;
          }
          uVar5 = 1;
          do {
            *(undefined8 *)(puVar4[uVar5 - 1] + 0x28) = puVar4[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
          *(undefined8 *)(puVar4[uVar8 - 1] + 0x28) = 0;
          *addr = (Curl_addrinfo *)*puVar4;
        }
        (*Curl_cfree)(rnd);
        CVar2 = CURLE_OK;
      }
      (*Curl_cfree)(puVar4);
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_shuffle_addr(struct Curl_easy *data, Curl_addrinfo **addr)
{
  CURLcode result = CURLE_OK;
  const int num_addrs = Curl_num_addresses(*addr);

  if(num_addrs > 1) {
    Curl_addrinfo **nodes;
    infof(data, "Shuffling %i addresses", num_addrs);

    nodes = malloc(num_addrs*sizeof(*nodes));
    if(nodes) {
      int i;
      unsigned int *rnd;
      const size_t rnd_size = num_addrs * sizeof(*rnd);

      /* build a plain array of Curl_addrinfo pointers */
      nodes[0] = *addr;
      for(i = 1; i < num_addrs; i++) {
        nodes[i] = nodes[i-1]->ai_next;
      }

      rnd = malloc(rnd_size);
      if(rnd) {
        /* Fisher-Yates shuffle */
        if(Curl_rand(data, (unsigned char *)rnd, rnd_size) == CURLE_OK) {
          Curl_addrinfo *swap_tmp;
          for(i = num_addrs - 1; i > 0; i--) {
            swap_tmp = nodes[rnd[i] % (i + 1)];
            nodes[rnd[i] % (i + 1)] = nodes[i];
            nodes[i] = swap_tmp;
          }

          /* relink list in the new order */
          for(i = 1; i < num_addrs; i++) {
            nodes[i-1]->ai_next = nodes[i];
          }

          nodes[num_addrs-1]->ai_next = NULL;
          *addr = nodes[0];
        }
        free(rnd);
      }
      else
        result = CURLE_OUT_OF_MEMORY;
      free(nodes);
    }
    else
      result = CURLE_OUT_OF_MEMORY;
  }
  return result;
}